

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

ClauseIterator __thiscall Inferences::CompositeISE::simplifyMany(CompositeISE *this,Clause *cl)

{
  undefined1 uVar1;
  ImmediateSimplificationEngine *pIVar2;
  long in_RDX;
  long in_RSI;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  ISList *curr;
  ClauseIterator *cIt;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  List<Inferences::ImmediateSimplificationEngine_*> *local_20;
  
  local_20 = *(List<Inferences::ImmediateSimplificationEngine_*> **)(in_RSI + 0x18);
  while( true ) {
    uVar3 = local_20 != (List<Inferences::ImmediateSimplificationEngine_*> *)0x0 && in_RDX != 0;
    if (local_20 == (List<Inferences::ImmediateSimplificationEngine_*> *)0x0 || in_RDX == 0) {
      Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
      return (ClauseIterator)in_RDI;
    }
    pIVar2 = Lib::List<Inferences::ImmediateSimplificationEngine_*>::head(local_20);
    (*(pIVar2->super_InferenceEngine)._vptr_InferenceEngine[5])(in_RDI,pIVar2,in_RDX);
    uVar1 = Lib::VirtualIterator<Kernel::Clause_*>::hasNext
                      ((VirtualIterator<Kernel::Clause_*> *)0x7f2a15);
    if ((bool)uVar1) break;
    local_20 = Lib::List<Inferences::ImmediateSimplificationEngine_*>::tail(local_20);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)
               CONCAT17(uVar3,CONCAT16(uVar1,in_stack_ffffffffffffffb0)));
  }
  return (ClauseIterator)in_RDI;
}

Assistant:

ClauseIterator CompositeISE::simplifyMany(Clause* cl)
{
  ISList* curr=_innersMany;
  while(curr && cl) {
    ClauseIterator cIt=curr->head()->simplifyMany(cl);
    if(cIt.hasNext()){
      return cIt;
    } else {
      curr=curr->tail();      
    }
  }
  return ClauseIterator::getEmpty();
}